

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

vector<Item,_std::allocator<Item>_> * __thiscall
Instance::sorted_items(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Instance *this)

{
  iterator iVar1;
  iterator iVar2;
  Instance *this_local;
  vector<Item,_std::allocator<Item>_> *sitems;
  
  std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__,&this->items);
  iVar1 = std::vector<Item,_std::allocator<Item>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<Item,_std::allocator<Item>_>::end(__return_storage_ptr__);
  std::stable_sort<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>>
            ((__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>)iVar1._M_current,
             (__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>)iVar2._M_current)
  ;
  iVar1 = std::vector<Item,_std::allocator<Item>_>::begin(__return_storage_ptr__);
  iVar2 = std::vector<Item,_std::allocator<Item>_>::end(__return_storage_ptr__);
  std::reverse<__gnu_cxx::__normal_iterator<Item*,std::vector<Item,std::allocator<Item>>>>
            ((__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>)iVar1._M_current,
             (__normal_iterator<Item_*,_std::vector<Item,_std::allocator<Item>_>_>)iVar2._M_current)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item> Instance::sorted_items() {
	std::vector<Item> sitems(items);
	std::stable_sort(all(sitems));
	std::reverse(all(sitems));
	return sitems;
}